

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_pointer.cc
# Opt level: O0

void simple_map(void)

{
  MappedReference<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>_> pLVar1;
  ostream *poVar2;
  key_arg<const_unsigned_long> local_b8 [2];
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>::iterator,_bool>
  local_a8;
  LatpLon local_90;
  LatpLon p;
  segment_manager *psStack_80;
  uint i;
  char_ptr_holder_t local_68;
  type local_60;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *local_40;
  map_t *map;
  undefined1 local_30 [8];
  managed_mapped_file mmap_file;
  
  boost::interprocess::permissions::permissions((permissions *)&map);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::basic_managed_mapped_file
            ((basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
              *)local_30,"map_iv.dat",1000000,0,(permissions *)&map);
  boost::interprocess::ipcdetail::char_ptr_holder<char>::char_ptr_holder(&local_68,"node_store");
  boost::interprocess::ipcdetail::
  basic_managed_memory_impl<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index,16ul>
  ::
  find_or_construct<phmap::flat_hash_map<unsigned_long_const,simple_map()::LatpLon,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>>
            (&local_60,local_30,local_68);
  psStack_80 = boost::interprocess::ipcdetail::
               basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
               ::get_segment_manager
                         ((basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
                           *)local_30);
  local_40 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
              *)boost::interprocess::ipcdetail::
                named_proxy<boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>,phmap::flat_hash_map<unsigned_long_const,simple_map()::LatpLon,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>,false>
                ::operator()((named_proxy<boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>,phmap::flat_hash_map<unsigned_long_const,simple_map()::LatpLon,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>,false>
                              *)&local_60,&stack0xffffffffffffff80);
  for (p.lon = 0; (uint)p.lon < 1000; p.lon = p.lon + 1) {
    local_90.latp = 10;
    local_90.lon = 10;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
    ::emplace<unsigned_int_&,_LatpLon_&,_0>(&local_a8,local_40,(uint *)&p.lon,&local_90);
  }
  local_b8[1] = 10;
  pLVar1 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
           ::
           at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                       *)local_40,local_b8 + 1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pLVar1->latp);
  poVar2 = std::operator<<(poVar2," ");
  local_b8[0] = 10;
  pLVar1 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
           ::
           at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                       *)local_40,local_b8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pLVar1->lon);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::~basic_managed_mapped_file
            ((basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
              *)local_30);
  return;
}

Assistant:

void simple_map() {
   struct LatpLon {
      int32_t latp;
      int32_t lon;
   };

   using nodestore_pair_t = std::pair<const uint64_t, LatpLon>;
   using map_t            = phmap::flat_hash_map<const uint64_t, LatpLon, std::hash<uint64_t>, std::equal_to<uint64_t>,
                                                 bi_alloc_t<nodestore_pair_t>>;

   auto mmap_file =
      boost::interprocess::managed_mapped_file(boost::interprocess::open_or_create, "map_iv.dat", 1000000);
   map_t* map = mmap_file.find_or_construct<map_t>("node_store")(mmap_file.get_segment_manager());

   for (unsigned int i = 0; i < 1000; ++i) {
      LatpLon p = {10, 10};
      map->emplace(i, p);
   }

   std::cout << map->at(10).latp << " " << map->at(10).lon << std::endl;
}